

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNla.cpp
# Opt level: O0

void __thiscall
HSimplexNla::transformForUpdate
          (HSimplexNla *this,HVector *aq,HVector *ep,HighsInt variable_in,HighsInt row_out)

{
  reference pvVar1;
  undefined4 in_ECX;
  string *in_RDX;
  HSimplexNla *in_RSI;
  long in_RDI;
  int in_R8D;
  double dVar2;
  HighsInt ix_1;
  double cp_scale_factor;
  double pivot_in_scaled_space;
  HighsInt ix;
  double cq_scale_factor;
  undefined8 in_stack_ffffffffffffff20;
  HighsInt iVar;
  HSimplexNla *in_stack_ffffffffffffff28;
  HSimplexNla *this_00;
  undefined8 in_stack_ffffffffffffff30;
  double dVar3;
  HVector *aq_00;
  HSimplexNla *in_stack_ffffffffffffff40;
  int local_a4;
  undefined1 local_89 [37];
  int local_64;
  HSimplexNla *local_60;
  allocator local_41;
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  
  if (*(long *)(in_RDI + 8) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"pack aq Bf ",&local_41);
    reportPackValue(in_RSI,in_RDX,(HVector *)CONCAT44(in_ECX,in_R8D),(bool)in_stack_ffffffffffffffdf
                   );
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    iVar = (HighsInt)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    local_60 = (HSimplexNla *)variableScaleFactor(in_stack_ffffffffffffff28,iVar);
    for (local_64 = 0;
        local_64 <
        *(int *)((long)&(in_RSI->factor_).var_with_no_pivot.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + 4); local_64 = local_64 + 1) {
      in_stack_ffffffffffffff40 = local_60;
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(in_RSI->factor_).refactor_info_.pivot_row,(long)local_64);
      *pvVar1 = (double)in_stack_ffffffffffffff40 * *pvVar1;
    }
    aq_00 = (HVector *)local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_89 + 1),"pack aq Af ",(allocator *)aq_00);
    reportPackValue(in_RSI,in_RDX,(HVector *)CONCAT44(in_ECX,in_R8D),(bool)in_stack_ffffffffffffffdf
                   );
    std::__cxx11::string::~string((string *)(local_89 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_89);
    pivotInScaledSpace(in_stack_ffffffffffffff40,aq_00,
                       (HighsInt)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (HighsInt)in_stack_ffffffffffffff30);
    this_00 = local_60;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RSI->timer_,(long)in_R8D);
    *pvVar1 = (double)this_00 * *pvVar1;
    dVar2 = basicColScaleFactor(this_00,iVar);
    dVar3 = dVar2;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&in_RSI->timer_,(long)in_R8D);
    *pvVar1 = *pvVar1 / dVar3;
    for (local_a4 = 0; local_a4 < *(int *)((long)&in_RDX[3].field_2 + 0xc); local_a4 = local_a4 + 1)
    {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)((long)&in_RDX[4].field_2 + 8),
                          (long)local_a4);
      *pvVar1 = *pvVar1 / dVar2;
    }
  }
  return;
}

Assistant:

void HSimplexNla::transformForUpdate(HVector* aq, HVector* ep,
                                     const HighsInt variable_in,
                                     const HighsInt row_out) {
  if (scale_ == NULL) return;
  // For (\hat)aq, UPDATE needs packValue and array[row_out] to
  // correspond to \bar{B}^{-1}(R.aq.cq), but CB.\bar{B}^{-1}(R.aq)
  // has been computed.
  //
  // Hence packValue and array[row_out] need to be scaled by cq;
  //
  // array[row_out] has to be unscaled by the corresponding entry of
  // CB
  //
  reportPackValue("pack aq Bf ", aq);
  double cq_scale_factor = variableScaleFactor(variable_in);

  for (HighsInt ix = 0; ix < aq->packCount; ix++)
    aq->packValue[ix] *= cq_scale_factor;
  reportPackValue("pack aq Af ", aq);
  //
  // Now focus on the pivot value, aq->array[row_out]
  double pivot_in_scaled_space = pivotInScaledSpace(aq, variable_in, row_out);
  // First scale by cq
  aq->array[row_out] *= cq_scale_factor;
  //
  // Also have to unscale by cp
  double cp_scale_factor = basicColScaleFactor(row_out);
  aq->array[row_out] /= cp_scale_factor;
  assert(pivot_in_scaled_space == aq->array[row_out]);
  // For (\hat)ep, UPDATE needs packValue to correspond to
  // \bar{B}^{-T}ep, but R.\bar{B}^{-T}(CB.ep) has been computed.
  //
  // Hence packValue needs to be unscaled by cp
  for (HighsInt ix = 0; ix < ep->packCount; ix++)
    ep->packValue[ix] /= cp_scale_factor;
}